

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-history.c
# Opt level: O0

void history_find_artifact(player *p,artifact *artifact)

{
  _Bool _Var1;
  bitflag local_ba [2];
  char local_b8 [6];
  bitflag flags [2];
  char text [80];
  char o_name [80];
  artifact *artifact_local;
  player *p_local;
  
  if (artifact != (artifact *)0x0) {
    _Var1 = history_mark_artifact_known(&p->hist,artifact);
    if (!_Var1) {
      get_artifact_name(text + 0x48,0x50,artifact);
      strnfmt(local_b8,0x50,"Found %s",text + 0x48);
      flag_wipe(local_ba,2);
      flag_on_dbg(local_ba,2,3,"flags","HIST_ARTIFACT_KNOWN");
      history_add_with_flags(p,local_b8,local_ba,artifact);
    }
    return;
  }
  __assert_fail("artifact != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-history.c"
                ,0xe1,"void history_find_artifact(struct player *, const struct artifact *)");
}

Assistant:

void history_find_artifact(struct player *p, const struct artifact *artifact)
{
	assert(artifact != NULL);

	/* Try revealing any existing artifact, otherwise log it */
	if (!history_mark_artifact_known(&p->hist, artifact)) {
		char o_name[80];
		char text[80];

		get_artifact_name(o_name, sizeof(o_name), artifact);
		strnfmt(text, sizeof(text), "Found %s", o_name);

		bitflag flags[HIST_SIZE];
		hist_wipe(flags);
		hist_on(flags, HIST_ARTIFACT_KNOWN);

		history_add_with_flags(p, text, flags, artifact);
	}
}